

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::operator=(SSVectorBase<double> *this,SSVectorBase<double> *rhs)

{
  int **p;
  double dVar1;
  int iVar2;
  int *piVar3;
  pointer pdVar4;
  Tolerances *this_00;
  long lVar5;
  ulong uVar6;
  pointer pdVar7;
  double dVar8;
  
  if (this != rhs) {
    clear(this);
    (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(rhs->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar2 = (rhs->super_IdxSet).len;
    (this->super_IdxSet).len = iVar2;
    p = &(this->super_IdxSet).idx;
    spx_realloc<int*>(p,iVar2);
    VectorBase<double>::reDim
              (&this->super_VectorBase<double>,
               (int)((ulong)((long)(rhs->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(rhs->super_VectorBase<double>).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3),true);
    if (rhs->setupStatus == true) {
      IdxSet::operator=(&this->super_IdxSet,&rhs->super_IdxSet);
      lVar5 = (long)(this->super_IdxSet).num;
      if (0 < lVar5) {
        piVar3 = *p;
        pdVar7 = (rhs->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar4 = (this->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar6 = lVar5 + 1;
        do {
          iVar2 = piVar3[uVar6 - 2];
          pdVar4[iVar2] = pdVar7[iVar2];
          uVar6 = uVar6 - 1;
        } while (1 < uVar6);
      }
    }
    else {
      (this->super_IdxSet).num = 0;
      pdVar7 = (rhs->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (0 < (int)((ulong)((long)(rhs->super_VectorBase<double>).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar7) >> 3)) {
        lVar5 = 0;
        do {
          dVar1 = pdVar7[lVar5];
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (this_00 == (Tolerances *)0x0) {
            dVar8 = 0.0;
          }
          else {
            dVar8 = Tolerances::epsilon(this_00);
            pdVar7 = (rhs->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          if (dVar8 < ABS(dVar1)) {
            (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar5] = pdVar7[lVar5];
            (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)lVar5;
            piVar3 = &(this->super_IdxSet).num;
            *piVar3 = *piVar3 + 1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (int)((ulong)((long)(rhs->super_VectorBase<double>).val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)pdVar7) >> 3));
      }
    }
    this->setupStatus = true;
  }
  return this;
}

Assistant:

SSVectorBase<R>& operator=(const SSVectorBase<R>& rhs)
   {
      assert(rhs.isConsistent());

      if(this != &rhs)
      {
         clear();
         _tolerances = rhs._tolerances;
         setMax(rhs.max());
         VectorBase<R>::reDim(rhs.dim());

         if(rhs.isSetup())
         {
            IdxSet::operator=(rhs);

            for(int i = size() - 1; i >= 0; --i)
            {
               int j = index(i);
               VectorBase<R>::val[j] = rhs.val[j];
            }
         }
         else
         {
            num = 0;

            for(int i = 0; i < rhs.dim(); ++i)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  VectorBase<R>::val[i] = rhs.val[i];
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;
      }

      assert(isConsistent());

      return *this;
   }